

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

BOOL Js::JavascriptOperators::SetElementIHelper
               (Var receiver,RecyclableObject *object,Var index,Var value,
               ScriptContext *scriptContext,PropertyOperationFlags flags)

{
  code *pcVar1;
  PropertyRecordUsageCache *propertyString;
  bool bVar2;
  IndexType IVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Var indexVar;
  uint uVar6;
  undefined4 in_register_0000008c;
  PropertyValueInfo local_b0;
  RecyclableObject *local_70;
  RecyclableObject *cacheOwner;
  PropertyRecordUsageCache *propertyRecordUsageCache;
  JavascriptString *propertyNameString;
  Var local_50;
  RecyclableObject *local_48;
  PropertyRecord *local_40;
  PropertyRecord *propertyRecord;
  uint32 indexVal;
  
  propertyNameString = (JavascriptString *)CONCAT44(in_register_0000008c,flags);
  propertyRecord._4_4_ = 0;
  local_40 = (PropertyRecord *)0x0;
  propertyRecordUsageCache = (PropertyRecordUsageCache *)0x0;
  bVar2 = GetPropertyRecordUsageCache
                    (index,scriptContext,(PropertyRecordUsageCache **)&cacheOwner,&local_70);
  if (bVar2) {
    bVar2 = SetElementIWithCache<false>
                      (receiver,object,local_70,value,(PropertyRecordUsageCache *)cacheOwner,
                       scriptContext,(PropertyOperationFlags)propertyNameString,
                       (PropertyCacheOperationInfo *)0x0);
LAB_00ab0251:
    return (uint)bVar2;
  }
  local_50 = value;
  local_48 = object;
  bVar2 = VarIs<Js::RecyclableObject>(receiver);
  if (!bVar2) {
    bVar2 = SetElementIOnTaggedNumber
                      (receiver,local_48,index,local_50,scriptContext,
                       (PropertyOperationFlags)propertyNameString);
    goto LAB_00ab0251;
  }
  if (((ulong)index & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)index & 0xffff000000000000) != 0x1000000000000) {
    uVar6 = 0;
    if (((ulong)index & 0xffff000000000000) != 0x1000000000000) {
      bVar2 = VarIs<Js::JavascriptString>(index);
      uVar6 = (uint)bVar2;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00ab044c;
    *puVar5 = 0;
    uVar6 = 0;
  }
  scriptContext->forinNoCache = scriptContext->forinNoCache + uVar6;
  indexVar = JavascriptConversion::ToPrimitive<(Js::JavascriptHint)1>(index,scriptContext);
  IVar3 = GetIndexTypeFromPrimitive
                    (indexVar,scriptContext,(uint32 *)((long)&propertyRecord + 4),&local_40,
                     (JavascriptString **)&propertyRecordUsageCache,false,true);
  propertyString = propertyRecordUsageCache;
  if (((scriptContext->threadContext->disableImplicitFlags & DisableImplicitCallFlag) !=
       DisableImplicitNoFlag) &&
     (scriptContext->threadContext->implicitCallFlags != ImplicitCall_None)) {
    return 0;
  }
  if (IVar3 == IndexType_JavascriptString) {
    if (propertyRecordUsageCache == (PropertyRecordUsageCache *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x12c3,"(propertyNameString)","propertyNameString");
      if (!bVar2) {
LAB_00ab044c:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    if ((local_40 != (PropertyRecord *)0x0) ||
       (ScriptContext::GetOrAddPropertyRecord
                  (scriptContext,(JavascriptString *)propertyString,&local_40),
       local_40->isNumeric != true)) goto LAB_00ab03ef;
    propertyRecord._4_4_ = PropertyRecord::GetNumericValue(local_40);
  }
  else if (IVar3 != IndexType_Number) {
    if (local_40 == (PropertyRecord *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x12d5,"(propertyRecord)","propertyRecord");
      if (!bVar2) goto LAB_00ab044c;
      *puVar5 = 0;
    }
LAB_00ab03ef:
    local_b0.m_instance = (RecyclableObject *)0x0;
    local_b0.m_propertyIndex = 0xffff;
    local_b0.m_attributes = '\0';
    local_b0.flags = InlineCacheNoFlags;
    local_b0.cacheInfoFlag = defaultInfoFlags;
    local_b0.inlineCache = (InlineCache *)0x0;
    local_b0.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
    local_b0.functionBody = (FunctionBody *)0x0;
    local_b0.prop = (RecyclableObject *)0x0;
    local_b0.propertyRecordUsageCache = (PropertyRecordUsageCache *)0x0;
    local_b0.inlineCacheIndex = 0xffffffff;
    local_b0.allowResizingPolymorphicInlineCache = true;
    BVar4 = SetProperty_Internal<false>
                      (receiver,local_48,false,local_40->pid,local_50,&local_b0,scriptContext,
                       (PropertyOperationFlags)propertyNameString);
    return BVar4;
  }
  BVar4 = SetItem(receiver,local_48,propertyRecord._4_4_,local_50,scriptContext,
                  (PropertyOperationFlags)propertyNameString,0);
  return BVar4;
}

Assistant:

BOOL JavascriptOperators::SetElementIHelper(Var receiver, RecyclableObject* object, Var index, Var value, ScriptContext* scriptContext, PropertyOperationFlags flags)
    {
        IndexType indexType;
        uint32 indexVal = 0;
        PropertyRecord const * propertyRecord = nullptr;
        JavascriptString * propertyNameString = nullptr;
        PropertyValueInfo propertyValueInfo;

        RecyclableObject* cacheOwner;
        PropertyRecordUsageCache* propertyRecordUsageCache;
        if (JavascriptOperators::GetPropertyRecordUsageCache(index, scriptContext, &propertyRecordUsageCache, &cacheOwner))
        {
            return JavascriptOperators::SetElementIWithCache<false>(receiver, object, cacheOwner, value, propertyRecordUsageCache, scriptContext, flags, nullptr);
        }

        if (TaggedNumber::Is(receiver))
        {
            return JavascriptOperators::SetElementIOnTaggedNumber(receiver, object, index, value, scriptContext, flags);
        }

#if DBG_DUMP
        scriptContext->forinNoCache += (!TaggedInt::Is(index) && VarIs<JavascriptString>(index));
#endif
        indexType = GetIndexType(index, scriptContext, &indexVal, &propertyRecord, &propertyNameString, false, true);
        if (scriptContext->GetThreadContext()->IsDisableImplicitCall() &&
            scriptContext->GetThreadContext()->GetImplicitCallFlags() != ImplicitCall_None)
        {
            // We hit an implicit call trying to convert the index, and implicit calls are disabled, so
            // quit before we try to store the element.
            return FALSE;
        }

        if (indexType == IndexType_Number)
        {
SetElementIHelper_INDEX_TYPE_IS_NUMBER:
            return JavascriptOperators::SetItem(receiver, object, indexVal, value, scriptContext, flags);
        }
        else if (indexType == IndexType_JavascriptString)
        {
            Assert(propertyNameString);

            // At this point, we know that the propertyNameString is neither PropertyString
            // or LiteralStringWithPropertyStringPtr.. Get PropertyRecord!
            // we will get it anyways otherwise. (Also, 1:1 string comparison for Builtin types will be expensive.)

            if (propertyRecord == nullptr)
            {
                scriptContext->GetOrAddPropertyRecord(propertyNameString, &propertyRecord);
                if (propertyRecord->IsNumeric())
                {
                    indexVal = propertyRecord->GetNumericValue();
                    goto SetElementIHelper_INDEX_TYPE_IS_NUMBER;
                }
            }
        }

        Assert(indexType == IndexType_PropertyId || indexType == IndexType_JavascriptString);
        Assert(propertyRecord);
        return JavascriptOperators::SetProperty(receiver, object, propertyRecord->GetPropertyId(), value, scriptContext, flags);
    }